

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O2

void __thiscall
Eigen::internal::
unary_evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>,_Eigen::internal::IndexBased,_float>
::unary_evaluator(unary_evaluator<Eigen::Block<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false>,_Eigen::internal::IndexBased,_float>
                  *this,XprType *block)

{
  long lVar1;
  
  product_evaluator<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  ::product_evaluator((product_evaluator<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
                       *)this,(XprType *)block);
  (this->m_startRow).m_value =
       (block->
       super_BlockImpl<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false,_false>
       .m_startRow.m_value;
  lVar1 = (block->
          super_BlockImpl<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false,_Eigen::Dense>
          ).
          super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false,_false>
          .m_startCol.m_value;
  (this->m_startCol).m_value = lVar1;
  (this->m_linear_offset).m_value =
       lVar1 * 4 +
       (block->
       super_BlockImpl<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false,_Eigen::Dense>
       ).
       super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>,_4,_3,_false,_false>
       .m_startRow.m_value;
  return;
}

Assistant:

explicit unary_evaluator(const XprType& block)
    : m_argImpl(block.nestedExpression()),
      m_startRow(block.startRow()),
      m_startCol(block.startCol()),
      m_linear_offset(ForwardLinearAccess?(ArgType::IsRowMajor ? block.startRow()*block.nestedExpression().cols() + block.startCol() : block.startCol()*block.nestedExpression().rows() + block.startRow()):0)
  { }